

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void __thiscall
kratos::InterfaceVisitor::update_interface_definition
          (InterfaceVisitor *this,shared_ptr<kratos::IDefinition> *def,InterfaceRef *ref,
          Generator *gen)

{
  mutex *__mutex;
  element_type *peVar1;
  bool bVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  UserException *pUVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>_>_>
  *this_00;
  basic_string_view<char> bVar7;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  undefined1 local_1a0 [8];
  _Rb_tree_node_base local_198;
  undefined8 local_170;
  undefined8 uStack_168;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  string local_120;
  string local_100;
  string local_e0;
  undefined1 local_c0 [32];
  mapped_type *local_a0;
  undefined1 local_98 [8];
  undefined1 auStack_90 [24];
  _Base_ptr local_78;
  size_t sStack_70;
  _Base_ptr local_68;
  size_t sStack_60;
  undefined1 local_50 [8];
  shared_ptr<kratos::IDefinition> ref_def;
  
  __mutex = &this->lock_;
  ref_def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)gen;
  std::mutex::lock(__mutex);
  this_00 = &this->interfaces_;
  (*((def->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    _vptr_IDefinition[7])((key_type *)local_98);
  iVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,(key_type *)local_98);
  std::__cxx11::string::~string((string *)local_98);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    (*((def->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      _vptr_IDefinition[7])(local_98);
    local_1a0 = (undefined1  [8])
                ref_def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
    local_198._0_8_ = ref;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<kratos::Generator*,kratos::InterfaceRef_const*>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<kratos::Generator*,kratos::InterfaceRef_const*>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::__cxx11::string,std::pair<kratos::Generator*,kratos::InterfaceRef_const*>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<kratos::Generator*,kratos::InterfaceRef_const*>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<kratos::Generator*,kratos::InterfaceRef_const*>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this_00,local_98);
    std::__cxx11::string::~string((string *)local_98);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  else {
    (*((def->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      _vptr_IDefinition[7])((key_type *)local_98);
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)this_00,(key_type *)local_98);
    std::__cxx11::string::~string((string *)local_98);
    std::__shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2> *)local_50,
               (__shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2> *)pmVar4->second);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    (*((def->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      _vptr_IDefinition[4])(local_1a0);
    (*(*(_func_int ***)local_50)[4])(local_98);
    bVar2 = std::operator!=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_98,
                            (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_1a0);
    local_a0 = pmVar4;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_98);
    if (bVar2) {
      pUVar6 = (UserException *)__cxa_allocate_exception(0x10);
      Generator::handle_name_abi_cxx11_
                ((string *)local_c0,
                 (Generator *)
                 ref_def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      (*((def->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        _vptr_IDefinition[7])(&local_120);
      Generator::handle_name_abi_cxx11_(&local_100,local_a0->first);
      (*(*(_func_int ***)local_50)[7])(&local_e0);
      local_98 = (undefined1  [8])local_c0._0_8_;
      auStack_90._0_8_ = local_c0._8_8_;
      auStack_90._8_8_ = local_120._M_dataplus._M_p;
      auStack_90._16_8_ = local_120._M_string_length;
      local_78 = (_Base_ptr)local_100._M_dataplus._M_p;
      sStack_70 = local_100._M_string_length;
      local_68 = (_Base_ptr)local_e0._M_dataplus._M_p;
      sStack_60 = local_e0._M_string_length;
      bVar7 = fmt::v7::to_string_view<char,_0>("{0}.{1}\'s interface differs from {2}.{3}\'s");
      format_str_01.data_ = (char *)bVar7.size_;
      format_str_01.size_ = 0xdddd;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_98;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)&local_150,(detail *)bVar7.data_,format_str_01,args_01);
      UserException::UserException(pUVar6,(string *)&local_150);
      __cxa_throw(pUVar6,&UserException::typeinfo,std::runtime_error::~runtime_error);
    }
    for (p_Var5 = local_198._M_left; p_Var5 != &local_198;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      peVar1 = (def->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*peVar1->_vptr_IDefinition[2])
                ((tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
                  *)local_98,peVar1,p_Var5 + 1);
      (*(*(_func_int ***)local_50)[2])(&local_150,local_50,p_Var5 + 1);
      bVar2 = std::operator!=((tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
                               *)local_98,
                              (tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
                               *)&local_150);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &local_150._M_impl.super__Rb_tree_header);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_90);
      if (bVar2) {
        pUVar6 = (UserException *)__cxa_allocate_exception(0x10);
        Generator::handle_name_abi_cxx11_
                  ((string *)local_c0,
                   (Generator *)
                   ref_def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        (*((def->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          _vptr_IDefinition[7])(&local_120);
        Generator::handle_name_abi_cxx11_(&local_100,local_a0->first);
        (*(*(_func_int ***)local_50)[7])(&local_e0);
        local_98 = (undefined1  [8])local_c0._0_8_;
        auStack_90._0_8_ = local_c0._8_8_;
        auStack_90._8_8_ = local_120._M_dataplus._M_p;
        auStack_90._16_8_ = local_120._M_string_length;
        local_78 = (_Base_ptr)local_100._M_dataplus._M_p;
        sStack_70 = local_100._M_string_length;
        local_68 = (_Base_ptr)local_e0._M_dataplus._M_p;
        sStack_60 = local_e0._M_string_length;
        bVar7 = fmt::v7::to_string_view<char,_0>("{0}.{1}\'s interface differs from {2}.{3}\'s");
        format_str.data_ = (char *)bVar7.size_;
        format_str.size_ = 0xdddd;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_98;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)&local_150,(detail *)bVar7.data_,format_str,args);
        UserException::UserException(pUVar6,(string *)&local_150);
        __cxa_throw(pUVar6,&UserException::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    (*((def->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      _vptr_IDefinition[5])(&local_150);
    (*(*(_func_int ***)local_50)[5])(local_98);
    bVar2 = std::operator!=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_98,
                            (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_150);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_98);
    if (bVar2) {
      pUVar6 = (UserException *)__cxa_allocate_exception(0x10);
      Generator::handle_name_abi_cxx11_
                (&local_120,
                 (Generator *)
                 ref_def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      (*((def->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        _vptr_IDefinition[7])(&local_100);
      Generator::handle_name_abi_cxx11_(&local_e0,local_a0->first);
      (*(*(_func_int ***)local_50)[7])(&local_170);
      local_98 = (undefined1  [8])local_120._M_dataplus._M_p;
      auStack_90._0_8_ = local_120._M_string_length;
      auStack_90._8_8_ = local_100._M_dataplus._M_p;
      auStack_90._16_8_ = local_100._M_string_length;
      local_78 = (_Base_ptr)local_e0._M_dataplus._M_p;
      sStack_70 = local_e0._M_string_length;
      local_68 = (_Base_ptr)local_170;
      sStack_60 = uStack_168;
      bVar7 = fmt::v7::to_string_view<char,_0>("{0}.{1}\'s interface differs from {2}.{3}\'s");
      format_str_02.data_ = (char *)bVar7.size_;
      format_str_02.size_ = 0xdddd;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_98;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)local_c0,(detail *)bVar7.data_,format_str_02,args_02);
      UserException::UserException(pUVar6,(string *)local_c0);
      __cxa_throw(pUVar6,&UserException::typeinfo,std::runtime_error::~runtime_error);
    }
    for (p_Var5 = local_150._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &local_150._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      peVar1 = (def->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*peVar1->_vptr_IDefinition[3])
                ((pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 local_98,peVar1,p_Var5 + 1);
      (*(*(_func_int ***)local_50)[3])
                ((pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 local_c0,local_50,p_Var5 + 1);
      bVar2 = std::operator!=((pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)local_98,
                              (pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)local_c0);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)(local_c0 + 8));
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_90);
      if (bVar2) {
        pUVar6 = (UserException *)__cxa_allocate_exception(0x10);
        Generator::handle_name_abi_cxx11_
                  (&local_120,
                   (Generator *)
                   ref_def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        (*((def->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          _vptr_IDefinition[7])(&local_100);
        Generator::handle_name_abi_cxx11_(&local_e0,local_a0->first);
        (*(*(_func_int ***)local_50)[7])(&local_170);
        local_98 = (undefined1  [8])local_120._M_dataplus._M_p;
        auStack_90._0_8_ = local_120._M_string_length;
        auStack_90._8_8_ = local_100._M_dataplus._M_p;
        auStack_90._16_8_ = local_100._M_string_length;
        local_78 = (_Base_ptr)local_e0._M_dataplus._M_p;
        sStack_70 = local_e0._M_string_length;
        local_68 = (_Base_ptr)local_170;
        sStack_60 = uStack_168;
        bVar7 = fmt::v7::to_string_view<char,_0>("{0}.{1}\'s interface differs from {2}.{3}\'s");
        format_str_00.data_ = (char *)bVar7.size_;
        format_str_00.size_ = 0xdddd;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_98;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)local_c0,(detail *)bVar7.data_,format_str_00,args_00);
        UserException::UserException(pUVar6,(string *)local_c0);
        __cxa_throw(pUVar6,&UserException::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_150);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ref_def);
  }
  return;
}

Assistant:

void update_interface_definition(const std::shared_ptr<IDefinition>& def,
                                     const InterfaceRef* ref, Generator* gen) {
        lock_.lock();
        if (interfaces_.find(def->def_name()) == interfaces_.end()) {
            interfaces_.emplace(def->def_name(), std::make_pair(gen, ref));
            lock_.unlock();
        } else {
            // making sure they are the same
            auto const& [reg_gen, ref_interface] = interfaces_.at(def->def_name());
            auto ref_def = ref_interface->definition();
            lock_.unlock();
            auto const& ports = def->ports();
            if (ref_def->ports() != ports)
                throw UserException(::format("{0}.{1}'s interface differs from {2}.{3}'s",
                                             gen->handle_name(), def->def_name(),
                                             reg_gen->handle_name(), ref_def->def_name()));
            for (auto const& port_name : ports) {
                if (def->port(port_name) != ref_def->port(port_name))
                    throw UserException(::format("{0}.{1}'s interface differs from {2}.{3}'s",
                                                 gen->handle_name(), def->def_name(),
                                                 reg_gen->handle_name(), ref_def->def_name()));
            }
            // same var as well
            auto const& vars = def->vars();
            if (ref_def->vars() != vars)
                throw UserException(::format("{0}.{1}'s interface differs from {2}.{3}'s",
                                             gen->handle_name(), def->def_name(),
                                             reg_gen->handle_name(), ref_def->def_name()));
            for (auto const& port_name : vars) {
                if (def->var(port_name) != ref_def->var(port_name))
                    throw UserException(::format("{0}.{1}'s interface differs from {2}.{3}'s",
                                                 gen->handle_name(), def->def_name(),
                                                 reg_gen->handle_name(), ref_def->def_name()));
            }
        }
    }